

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintThreeGeneric::Increment_q(ChConstraintThreeGeneric *this,double deltal)

{
  ChVariables *pCVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Index size;
  Index index;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined8 in_XMM0_Qb;
  ChVectorRef local_30;
  
  pCVar1 = (this->super_ChConstraintThree).variables_a;
  if (pCVar1->disabled == false) {
    uVar6 = (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((long)uVar6 < 0) goto LAB_007f5464;
    ChVariables::Get_qb(&local_30,pCVar1);
    if (local_30.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ != uVar6) goto LAB_007f5486;
    auVar3._8_8_ = in_XMM0_Qb;
    auVar3._0_8_ = deltal;
    uVar6 = local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_;
    if (((local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)local_30.
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                        ._0_8_ >> 3) & 0x1fffffff) & 7),
       (long)local_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_ <= (long)uVar6)) {
      uVar6 = local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_;
    }
    pdVar2 = (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar8 = local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ - uVar6;
    uVar7 = uVar8 + 7;
    if (-1 < (long)uVar8) {
      uVar7 = uVar8;
    }
    if (0 < (long)uVar6) {
      uVar9 = 0;
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar9 * 8) =
             deltal * pdVar2[uVar9] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar9 * 8);
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
    uVar7 = (uVar7 & 0xfffffffffffffff8) + uVar6;
    if (7 < (long)uVar8) {
      auVar10 = vbroadcastsd_avx512f(auVar3);
      do {
        auVar11 = vmulpd_avx512f(auVar10,*(undefined1 (*) [64])(pdVar2 + uVar6));
        auVar11 = vaddpd_avx512f(auVar11,*(undefined1 (*) [64])
                                          (local_30.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ + uVar6 * 8));
        *(undefined1 (*) [64])
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar6 * 8) = auVar11;
        uVar6 = uVar6 + 8;
      } while ((long)uVar6 < (long)uVar7);
    }
    if ((long)uVar7 <
        (long)local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_) {
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar7 * 8) =
             deltal * pdVar2[uVar7] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_ != uVar7);
    }
  }
  pCVar1 = (this->super_ChConstraintThree).variables_b;
  if (pCVar1->disabled == false) {
    uVar6 = (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((long)uVar6 < 0) goto LAB_007f5464;
    ChVariables::Get_qb(&local_30,pCVar1);
    if (local_30.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ != uVar6) goto LAB_007f5486;
    auVar4._8_8_ = in_XMM0_Qb;
    auVar4._0_8_ = deltal;
    uVar6 = local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_;
    if (((local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)local_30.
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                        ._0_8_ >> 3) & 0x1fffffff) & 7),
       (long)local_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_ <= (long)uVar6)) {
      uVar6 = local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_;
    }
    pdVar2 = (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar8 = local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ - uVar6;
    uVar7 = uVar8 + 7;
    if (-1 < (long)uVar8) {
      uVar7 = uVar8;
    }
    if (0 < (long)uVar6) {
      uVar9 = 0;
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar9 * 8) =
             deltal * pdVar2[uVar9] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar9 * 8);
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
    uVar7 = (uVar7 & 0xfffffffffffffff8) + uVar6;
    if (7 < (long)uVar8) {
      auVar10 = vbroadcastsd_avx512f(auVar4);
      do {
        auVar11 = vmulpd_avx512f(auVar10,*(undefined1 (*) [64])(pdVar2 + uVar6));
        auVar11 = vaddpd_avx512f(auVar11,*(undefined1 (*) [64])
                                          (local_30.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ + uVar6 * 8));
        *(undefined1 (*) [64])
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar6 * 8) = auVar11;
        uVar6 = uVar6 + 8;
      } while ((long)uVar6 < (long)uVar7);
    }
    if ((long)uVar7 <
        (long)local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_) {
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar7 * 8) =
             deltal * pdVar2[uVar7] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_ != uVar7);
    }
  }
  pCVar1 = (this->super_ChConstraintThree).variables_c;
  if (pCVar1->disabled == false) {
    uVar6 = (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((long)uVar6 < 0) {
LAB_007f5464:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    ChVariables::Get_qb(&local_30,pCVar1);
    if (local_30.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ != uVar6) {
LAB_007f5486:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    auVar5._8_8_ = in_XMM0_Qb;
    auVar5._0_8_ = deltal;
    uVar6 = local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_;
    if (((local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)local_30.
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                        ._0_8_ >> 3) & 0x1fffffff) & 7),
       (long)local_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_ <= (long)uVar6)) {
      uVar6 = local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_;
    }
    pdVar2 = (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar8 = local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ - uVar6;
    uVar7 = uVar8 + 7;
    if (-1 < (long)uVar8) {
      uVar7 = uVar8;
    }
    if (0 < (long)uVar6) {
      uVar9 = 0;
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar9 * 8) =
             deltal * pdVar2[uVar9] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar9 * 8);
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
    uVar7 = (uVar7 & 0xfffffffffffffff8) + uVar6;
    if (7 < (long)uVar8) {
      auVar10 = vbroadcastsd_avx512f(auVar5);
      do {
        auVar11 = vmulpd_avx512f(auVar10,*(undefined1 (*) [64])(pdVar2 + uVar6));
        auVar11 = vaddpd_avx512f(auVar11,*(undefined1 (*) [64])
                                          (local_30.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ + uVar6 * 8));
        *(undefined1 (*) [64])
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar6 * 8) = auVar11;
        uVar6 = uVar6 + 8;
      } while ((long)uVar6 < (long)uVar7);
    }
    if ((long)uVar7 <
        (long)local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_) {
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar7 * 8) =
             deltal * pdVar2[uVar7] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_ != uVar7);
    }
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::Increment_q(const double deltal) {
    if (variables_a->IsActive()) {
        variables_a->Get_qb() += Eq_a * deltal;
    }

    if (variables_b->IsActive()) {
        variables_b->Get_qb() += Eq_b * deltal;
    }

    if (variables_c->IsActive()) {
        variables_c->Get_qb() += Eq_c * deltal;
    }
}